

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

PropertyRecord * __thiscall
ThreadContext::AddSymbolToRegistrationMap
          (ThreadContext *this,char16 *stringKey,charcount_t stringLength)

{
  code *pcVar1;
  bool bVar2;
  charcount_t len;
  undefined4 *puVar3;
  Recycler *pRVar4;
  HashedCharacterBuffer<char16_t> *this_00;
  char16 *string;
  RecyclableData *pRVar5;
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  TrackAllocData local_58;
  HashedCharacterBuffer<char16_t> *local_30;
  HashedCharacterBuffer<char16_t> *propertyName;
  PropertyRecord *propertyRecord;
  char16 *pcStack_18;
  charcount_t stringLength_local;
  char16 *stringKey_local;
  ThreadContext *this_local;
  
  propertyRecord._4_4_ = stringLength;
  pcStack_18 = stringKey;
  stringKey_local = (char16 *)this;
  EnsureSymbolRegistrationMap(this);
  propertyName = (HashedCharacterBuffer<char16_t> *)
                 UncheckedAddPropertyId(this,pcStack_18,propertyRecord._4_4_,false,true);
  if ((PropertyRecord *)propertyName == (PropertyRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x10d7,"(propertyRecord)","propertyRecord");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pRVar4 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&Js::HashedCharacterBuffer<char16_t>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
             ,0x10dd);
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_58);
  this_00 = (HashedCharacterBuffer<char16_t> *)new<Memory::Recycler>(0x10,pRVar4,0x43c4b0);
  string = Js::PropertyRecord::GetBuffer((PropertyRecord *)propertyName);
  len = Js::PropertyRecord::GetLength((PropertyRecord *)propertyName);
  Js::HashedCharacterBuffer<char16_t>::HashedCharacterBuffer(this_00,string,len);
  local_30 = this_00;
  pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(&this->recyclableData)
  ;
  this_01 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&pRVar5->symbolRegistrationMap);
  JsUtil::
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Add(this_01,&local_30,(PropertyRecord **)&propertyName);
  return (PropertyRecord *)propertyName;
}

Assistant:

const Js::PropertyRecord* ThreadContext::AddSymbolToRegistrationMap(const char16* stringKey, charcount_t stringLength)
{
    this->EnsureSymbolRegistrationMap();

    const Js::PropertyRecord* propertyRecord = this->UncheckedAddPropertyId(stringKey, stringLength, /*bind*/false, /*isSymbol*/true);

    Assert(propertyRecord);

    // We need to support null characters in the Symbol names. For e.g. "A\0Z" is a valid symbol name and is different than "A\0Y".
    // However, as the key contains a null character we need to hash the symbol name past the null character. The default implementation terminates
    // at the null character, so we use the Js::HashedCharacterBuffer as key. We allocate the key in the recycler memory as it needs to be around
    // for the lifetime of the map.
    Js::HashedCharacterBuffer<char16> * propertyName = RecyclerNew(GetRecycler(), Js::HashedCharacterBuffer<char16>, propertyRecord->GetBuffer(), propertyRecord->GetLength());
    this->recyclableData->symbolRegistrationMap->Add(propertyName, propertyRecord);

    return propertyRecord;
}